

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O3

void term_scroll_to_selection(Terminal *term,wchar_t which_end)

{
  wchar_t where;
  wchar_t wVar1;
  uint uVar2;
  
  wVar1 = sblines(term);
  if (term->selstate == SEEN_OSC) {
    uVar2 = *(int *)(term->wordness + (ulong)(which_end != L'\0') * 4 + -0xc) - term->rows / 2;
    where = (int)uVar2 >> 0x1f & uVar2;
    if (SBORROW4(uVar2,-wVar1) != uVar2 + wVar1 < 0) {
      where = -wVar1;
    }
    term_scroll(term,L'\xffffffff',where);
    return;
  }
  return;
}

Assistant:

void term_scroll_to_selection(Terminal *term, int which_end)
{
    pos target;
    int y;
    int sbtop = -sblines(term);

    if (term->selstate != SELECTED)
        return;
    if (which_end)
        target = term->selend;
    else
        target = term->selstart;

    y = target.y - term->rows/2;
    if (y < sbtop)
        y = sbtop;
    else if (y > 0)
        y = 0;
    term_scroll(term, -1, y);
}